

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

void __thiscall ftxui::MenuBase::~MenuBase(MenuBase *this)

{
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__MenuBase_00168440;
  std::_Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>::~_Vector_base
            (&(this->boxes_).super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>);
  MenuOption::~MenuOption(&(this->option_).owned_);
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

MenuBase(ConstStringListRef entries, int* selected, Ref<MenuOption> option)
      : entries_(entries), selected_(selected), option_(option) {}